

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O2

int mriStepCoupling_GetStageType(MRIStepCoupling MRIC,int is)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  
  uVar2 = 0xffffffd7;
  if ((0 < is) && (is < MRIC->stages)) {
    if (MRIC->G == (realtype ***)0x0) {
      bVar1 = false;
    }
    else {
      uVar4 = 0;
      uVar3 = (ulong)(uint)MRIC->nmat;
      if (MRIC->nmat < 1) {
        uVar3 = uVar4;
      }
      dVar5 = 0.0;
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        dVar5 = dVar5 + ABS(MRIC->G[uVar4][(uint)is][(uint)is]);
      }
      bVar1 = 2.220446049250313e-14 < dVar5;
    }
    dVar5 = MRIC->c[(uint)is] - MRIC->c[(ulong)(uint)is - 1];
    if (bVar1) {
      return 2.220446049250313e-14 < dVar5 | 2;
    }
    uVar2 = (uint)(dVar5 <= 2.220446049250313e-14);
  }
  return uVar2;
}

Assistant:

int mriStepCoupling_GetStageType(MRIStepCoupling MRIC, int is)
{
  int i;
  realtype Gabs, cdiff;
  const realtype tol = RCONST(100.0) * UNIT_ROUNDOFF;

  if ((is < 1) || (is >= MRIC->stages)) return ARK_INVALID_TABLE;

  /* sum of stage diagonal entries across implicit tables */
  Gabs = ZERO;
  if (MRIC->G)
    for (i = 0; i < MRIC->nmat; i++)
      Gabs += SUNRabs(MRIC->G[i][is][is]);

  /* abscissae difference */
  cdiff = MRIC->c[is] - MRIC->c[is-1];

  if (Gabs > tol) {     /* DIRK */
    if (cdiff > tol) {  /* Fast */
      return(MRISTAGE_DIRK_FAST);
    } else {
      return(MRISTAGE_DIRK_NOFAST);
    }
  } else {              /* ERK */
    if (cdiff > tol) {  /* Fast */
      return(MRISTAGE_ERK_FAST);
    } else {
      return(MRISTAGE_ERK_NOFAST);
    }
  }
}